

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_nt_test.c
# Opt level: O0

int dec_nt_decode(MpiDecTestCmd *cmd)

{
  MPP_RET local_154;
  MppCtx pvStack_150;
  MPP_RET ret;
  MpiDecLoopData data;
  pthread_attr_t attr;
  pthread_t thd;
  MppBuffer frm_buf;
  long lStack_48;
  RK_U32 need_split;
  MppDecCfg cfg;
  RK_U32 local_38;
  MppCodingType type;
  RK_U32 height;
  RK_U32 width;
  MppFrame frame;
  MppPacket packet;
  MppApi *mpi;
  MppCtx ctx;
  MpiDecTestCmd *cmd_local;
  
  mpi = (MppApi *)0x0;
  packet = (MppPacket)0x0;
  frame = (MppFrame)0x0;
  _height = (MppPacket)0x0;
  type = cmd->width;
  local_38 = cmd->height;
  cfg._4_4_ = cmd->type;
  lStack_48 = 0;
  frm_buf._4_4_ = 1;
  thd = 0;
  local_154 = MPP_OK;
  ctx = cmd;
  _mpp_log_l(4,"mpi_dec_nt_test","mpi_dec_test start\n");
  memset(&stack0xfffffffffffffeb0,0,0xb8);
  pthread_attr_init((pthread_attr_t *)&data.checkcrc.chroma.vor);
  *(uint *)((long)ctx + 0x218) = (uint)(*(int *)((long)ctx + 0x200) != 8);
  if ((*(int *)((long)ctx + 0x214) == 0) ||
     (data.frame = fopen((char *)((long)ctx + 0x100),"w+b"), (FILE *)data.frame != (FILE *)0x0)) {
    if ((*(long *)((long)ctx + 600) != 0) &&
       (data.delay = (RK_S64)fopen(*(char **)((long)ctx + 600),"wt"),
       (FILE *)data.delay == (FILE *)0x0)) {
      _mpp_log_l(2,"mpi_dec_nt_test","failed to open verify file %s\n",0,
                 *(undefined8 *)((long)ctx + 600));
    }
    local_154 = dec_buf_mgr_init((DecBufMgr *)&data.quiet);
    if (local_154 == MPP_OK) {
      local_154 = mpp_packet_init(&frame,0);
      _mpp_log_l(2,"mpi_dec_nt_test","mpp_packet_init get %p\n","dec_nt_decode",frame);
      if (local_154 == MPP_OK) {
        local_154 = mpp_create(&mpi,&packet);
        if (local_154 == MPP_OK) {
          _mpp_log_l(4,"mpi_dec_nt_test","%p mpi_dec_test decoder test start w %d h %d type %d\n",0,
                     mpi,type,local_38,cfg._4_4_);
          (**(code **)((long)packet + 0x70))(mpi,0x200008,0);
          local_154 = mpp_init(mpi,0,cfg._4_4_);
          if (local_154 == MPP_OK) {
            mpp_dec_cfg_init(&stack0xffffffffffffffb8);
            local_154 = (**(code **)((long)packet + 0x70))(mpi,0x310202,lStack_48);
            if (local_154 == MPP_OK) {
              local_154 = mpp_dec_cfg_set_u32(lStack_48,"base:split_parse",frm_buf._4_4_);
              if (local_154 == MPP_OK) {
                local_154 = (**(code **)((long)packet + 0x70))(mpi,0x310201,lStack_48);
                if (local_154 == MPP_OK) {
                  pvStack_150 = ctx;
                  data.cmd = (MpiDecTestCmd *)mpi;
                  data.ctx = packet;
                  data.mpi._4_4_ = 0;
                  data.frm_grp = frame;
                  data.packet = _height;
                  data.fp_output._0_4_ = 0;
                  data.fp_output._4_4_ = *(undefined4 *)((long)ctx + 0x220);
                  data.mpi._0_4_ = *(undefined4 *)((long)ctx + 0x250);
                  pthread_attr_setdetachstate((pthread_attr_t *)&data.checkcrc.chroma.vor,0);
                  local_154 = pthread_create((pthread_t *)(attr.__size + 0x30),
                                             (pthread_attr_t *)&data.checkcrc.chroma.vor,
                                             thread_decode,&stack0xfffffffffffffeb0);
                  if (local_154 == MPP_OK) {
                    if (*(int *)((long)ctx + 0x220) < 0) {
                      _mpp_log_l(4,"mpi_dec_nt_test","*******************************************\n"
                                 ,0);
                      _mpp_log_l(4,"mpi_dec_nt_test","**** Press Enter to stop loop decoding ****\n"
                                 ,0);
                      _mpp_log_l(4,"mpi_dec_nt_test","*******************************************\n"
                                 ,0);
                      getc(_stdin);
                      data.mpi._4_4_ = 1;
                    }
                    pthread_join(attr._48_8_,(void **)0x0);
                    *(RK_S64 *)((long)ctx + 0x238) = data.first_frm;
                    local_154 = (**(code **)((long)packet + 0x68))(mpi);
                    if (local_154 != MPP_OK) {
                      _mpp_log_l(2,"mpi_dec_nt_test","%p mpi->reset failed\n",0,mpi);
                    }
                  }
                  else {
                    _mpp_log_l(2,"mpi_dec_nt_test","failed to create thread for input ret %d\n",0,
                               local_154);
                  }
                }
                else {
                  _mpp_log_l(2,"mpi_dec_nt_test","%p failed to set cfg %p ret %d\n",0,mpi,lStack_48,
                             local_154);
                }
              }
              else {
                _mpp_log_l(2,"mpi_dec_nt_test","%p failed to set split_parse ret %d\n",0,mpi,
                           local_154);
              }
            }
            else {
              _mpp_log_l(2,"mpi_dec_nt_test","%p failed to get decoder cfg ret %d\n",0,mpi,local_154
                        );
            }
          }
          else {
            _mpp_log_l(2,"mpi_dec_nt_test","%p mpp_init failed\n",0,mpi);
          }
        }
        else {
          _mpp_log_l(2,"mpi_dec_nt_test","mpp_create failed\n",0);
        }
      }
      else {
        _mpp_log_l(2,"mpi_dec_nt_test","mpp_packet_init failed\n",0);
      }
    }
    else {
      _mpp_log_l(2,"mpi_dec_nt_test","dec_buf_mgr_init failed\n",0);
    }
  }
  else {
    _mpp_log_l(2,"mpi_dec_nt_test","failed to open output file %s\n",0,(long)ctx + 0x100);
  }
  if (data.frm_grp != (MppBufferGroup)0x0) {
    mpp_packet_deinit(&data.frm_grp);
    data.frm_grp = (MppBufferGroup)0x0;
  }
  if (_height != (MppPacket)0x0) {
    mpp_frame_deinit(&height);
    _height = (MppPacket)0x0;
  }
  if (mpi != (MppApi *)0x0) {
    mpp_destroy(mpi);
    mpi = (MppApi *)0x0;
  }
  if ((*(int *)((long)ctx + 0x218) == 0) && (thd != 0)) {
    mpp_buffer_put_with_caller(thd,"dec_nt_decode");
    thd = 0;
  }
  data.buf_mgr = (DecBufMgr)0x0;
  if (data._24_8_ != 0) {
    dec_buf_mgr_deinit((DecBufMgr)data._24_8_);
    data.quiet = 0;
    data.loop_end = 0;
  }
  if (data.frame != (MppFrame)0x0) {
    fclose((FILE *)data.frame);
    data.frame = (MppFrame)0x0;
  }
  if (data.delay != 0) {
    fclose((FILE *)data.delay);
    data.delay = 0;
  }
  if (lStack_48 != 0) {
    mpp_dec_cfg_deinit(lStack_48);
    lStack_48 = 0;
  }
  pthread_attr_destroy((pthread_attr_t *)&data.checkcrc.chroma.vor);
  return local_154;
}

Assistant:

int dec_nt_decode(MpiDecTestCmd *cmd)
{
    // base flow context
    MppCtx ctx          = NULL;
    MppApi *mpi         = NULL;

    // input / output
    MppPacket packet    = NULL;
    MppFrame  frame     = NULL;

    // paramter for resource malloc
    RK_U32 width        = cmd->width;
    RK_U32 height       = cmd->height;
    MppCodingType type  = cmd->type;

    // config for runtime mode
    MppDecCfg cfg       = NULL;
    RK_U32 need_split   = 1;

    // resources
    MppBuffer frm_buf   = NULL;
    pthread_t thd;
    pthread_attr_t attr;
    MpiDecLoopData data;
    MPP_RET ret = MPP_OK;

    mpp_log("mpi_dec_test start\n");
    memset(&data, 0, sizeof(data));
    pthread_attr_init(&attr);

    cmd->simple = (cmd->type != MPP_VIDEO_CodingMJPEG) ? (1) : (0);

    if (cmd->have_output) {
        data.fp_output = fopen(cmd->file_output, "w+b");
        if (NULL == data.fp_output) {
            mpp_err("failed to open output file %s\n", cmd->file_output);
            goto MPP_TEST_OUT;
        }
    }

    if (cmd->file_slt) {
        data.fp_verify = fopen(cmd->file_slt, "wt");
        if (!data.fp_verify)
            mpp_err("failed to open verify file %s\n", cmd->file_slt);
    }

    ret = dec_buf_mgr_init(&data.buf_mgr);
    if (ret) {
        mpp_err("dec_buf_mgr_init failed\n");
        goto MPP_TEST_OUT;
    }

    ret = mpp_packet_init(&packet, NULL, 0);
    mpp_err_f("mpp_packet_init get %p\n", packet);
    if (ret) {
        mpp_err("mpp_packet_init failed\n");
        goto MPP_TEST_OUT;
    }

    // decoder demo
    ret = mpp_create(&ctx, &mpi);
    if (ret) {
        mpp_err("mpp_create failed\n");
        goto MPP_TEST_OUT;
    }

    mpp_log("%p mpi_dec_test decoder test start w %d h %d type %d\n",
            ctx, width, height, type);

    ret = mpi->control(ctx, MPP_SET_DISABLE_THREAD, NULL);

    ret = mpp_init(ctx, MPP_CTX_DEC, type);
    if (ret) {
        mpp_err("%p mpp_init failed\n", ctx);
        goto MPP_TEST_OUT;
    }

    mpp_dec_cfg_init(&cfg);

    /* get default config from decoder context */
    ret = mpi->control(ctx, MPP_DEC_GET_CFG, cfg);
    if (ret) {
        mpp_err("%p failed to get decoder cfg ret %d\n", ctx, ret);
        goto MPP_TEST_OUT;
    }

    /*
     * split_parse is to enable mpp internal frame spliter when the input
     * packet is not aplited into frames.
     */
    ret = mpp_dec_cfg_set_u32(cfg, "base:split_parse", need_split);
    if (ret) {
        mpp_err("%p failed to set split_parse ret %d\n", ctx, ret);
        goto MPP_TEST_OUT;
    }

    ret = mpi->control(ctx, MPP_DEC_SET_CFG, cfg);
    if (ret) {
        mpp_err("%p failed to set cfg %p ret %d\n", ctx, cfg, ret);
        goto MPP_TEST_OUT;
    }

    data.cmd            = cmd;
    data.ctx            = ctx;
    data.mpi            = mpi;
    data.loop_end       = 0;
    data.packet         = packet;
    data.frame          = frame;
    data.frame_count    = 0;
    data.frame_num      = cmd->frame_num;
    data.quiet          = cmd->quiet;

    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);

    ret = pthread_create(&thd, &attr, thread_decode, &data);
    if (ret) {
        mpp_err("failed to create thread for input ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    if (cmd->frame_num < 0) {
        // wait for input then quit decoding
        mpp_log("*******************************************\n");
        mpp_log("**** Press Enter to stop loop decoding ****\n");
        mpp_log("*******************************************\n");

        getc(stdin);
        data.loop_end = 1;
    }

    pthread_join(thd, NULL);

    cmd->max_usage = data.max_usage;

    ret = mpi->reset(ctx);
    if (ret) {
        mpp_err("%p mpi->reset failed\n", ctx);
        goto MPP_TEST_OUT;
    }

MPP_TEST_OUT:
    if (data.packet) {
        mpp_packet_deinit(&data.packet);
        data.packet = NULL;
    }

    if (frame) {
        mpp_frame_deinit(&frame);
        frame = NULL;
    }

    if (ctx) {
        mpp_destroy(ctx);
        ctx = NULL;
    }

    if (!cmd->simple) {
        if (frm_buf) {
            mpp_buffer_put(frm_buf);
            frm_buf = NULL;
        }
    }

    data.frm_grp = NULL;
    if (data.buf_mgr) {
        dec_buf_mgr_deinit(data.buf_mgr);
        data.buf_mgr = NULL;
    }

    if (data.fp_output) {
        fclose(data.fp_output);
        data.fp_output = NULL;
    }

    if (data.fp_verify) {
        fclose(data.fp_verify);
        data.fp_verify = NULL;
    }

    if (cfg) {
        mpp_dec_cfg_deinit(cfg);
        cfg = NULL;
    }

    pthread_attr_destroy(&attr);

    return ret;
}